

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::OP_DeleteElementI
              (Var instance,Var index,ScriptContext *scriptContext,
              PropertyOperationFlags propertyOperationFlags)

{
  code *pcVar1;
  bool bVar2;
  IndexType IVar3;
  int iVar4;
  RecyclableObject *instance_00;
  undefined4 *puVar5;
  JavascriptBoolean *pJVar6;
  JavascriptString *pJVar7;
  PropertyRecord *local_50;
  PropertyRecord *debugPropertyRecord;
  JavascriptString *propertyNameString;
  Var index_local;
  PropertyRecord *propertyRecord;
  uint32 indexVal;
  
  propertyNameString = (JavascriptString *)index;
  bVar2 = TaggedNumber::Is(instance);
  if (bVar2) {
    return (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).booleanTrue.ptr;
  }
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(instance);
  instance_00 = VarTo<Js::RecyclableObject>(instance);
  if ((int)((instance_00->type).ptr)->typeId < 2) {
    pJVar7 = GetPropertyDisplayNameForError(index,scriptContext);
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec47,pJVar7);
  }
  index_local = (Var)0x0;
  debugPropertyRecord = (PropertyRecord *)0x0;
  IVar3 = GetIndexType(&propertyNameString,scriptContext,(uint32 *)((long)&propertyRecord + 4),
                       (PropertyRecord **)&index_local,(JavascriptString **)&debugPropertyRecord,
                       false,true);
  if (IVar3 == IndexType_JavascriptString) {
    iVar4 = (*(instance_00->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x22])
                      (instance_00,debugPropertyRecord,(ulong)propertyOperationFlags);
  }
  else if (IVar3 == IndexType_PropertyId) {
    if (index_local == (Var)0x0) {
      bVar2 = CanShortcutOnUnknownPropertyName(instance_00);
      if (!bVar2) {
        IVar3 = GetIndexTypeFromPrimitive
                          (propertyNameString,scriptContext,(uint32 *)((long)&propertyRecord + 4),
                           (PropertyRecord **)&index_local,true);
        if (IVar3 != IndexType_PropertyId) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x14f5,"(indexType == IndexType_PropertyId)",
                                      "indexType == IndexType_PropertyId");
          if (!bVar2) goto LAB_0099fa60;
          *puVar5 = 0;
        }
        if (index_local != (Var)0x0) goto LAB_0099f900;
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x14f6,"(propertyRecord != nullptr)",
                                    "propertyRecord != nullptr");
        if (!bVar2) goto LAB_0099fa60;
        *puVar5 = 0;
      }
      if (index_local == (Var)0x0) {
        pJVar7 = JavascriptConversion::ToString(propertyNameString,scriptContext);
        ScriptContext::GetOrAddPropertyRecord(scriptContext,pJVar7,&local_50);
        iVar4 = (*(instance_00->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x21])
                          (instance_00,(ulong)(uint)local_50->pid,(ulong)propertyOperationFlags);
        if (iVar4 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x1503,
                                      "(JavascriptOperators::DeleteProperty(object, debugPropertyRecord->GetPropertyId(), propertyOperationFlags))"
                                      ,
                                      "delete should have been true. See OS Bug 2727708 if you see this come from the web"
                                     );
          if (!bVar2) goto LAB_0099fa60;
          *puVar5 = 0;
        }
        iVar4 = 1;
        goto LAB_0099f93e;
      }
    }
LAB_0099f900:
    iVar4 = (*(instance_00->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x21])
                      (instance_00,(ulong)*(uint *)((long)index_local + 8),
                       (ulong)propertyOperationFlags);
  }
  else {
    iVar4 = (*(instance_00->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x2a])
                      (instance_00,(ulong)propertyRecord._4_4_,(ulong)propertyOperationFlags);
  }
LAB_0099f93e:
  if (((propertyOperationFlags &
       (PropertyOperation_ThrowOnDeleteIfNotConfig|PropertyOperation_StrictMode)) !=
       PropertyOperation_None) && (iVar4 == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1508,
                                "(result || !(propertyOperationFlags & (PropertyOperation_StrictMode | PropertyOperation_ThrowOnDeleteIfNotConfig)))"
                                ,
                                "result || !(propertyOperationFlags & (PropertyOperation_StrictMode | PropertyOperation_ThrowOnDeleteIfNotConfig))"
                               );
    if (!bVar2) {
LAB_0099fa60:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  pJVar6 = JavascriptLibrary::CreateBoolean
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary,iVar4);
  return pJVar6;
}

Assistant:

Var JavascriptOperators::OP_DeleteElementI(Var instance, Var index, ScriptContext* scriptContext, PropertyOperationFlags propertyOperationFlags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_DeleteElementI);
        if(TaggedNumber::Is(instance))
        {
            return scriptContext->GetLibrary()->GetTrue();
        }

#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(instance);
#endif
        RecyclableObject* object = VarTo<RecyclableObject>(instance);
        if (JavascriptOperators::IsUndefinedOrNull(object))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_CannotDelete_NullOrUndefined, GetPropertyDisplayNameForError(index, scriptContext));
        }

        uint32 indexVal;
        PropertyRecord const * propertyRecord = nullptr;
        JavascriptString * propertyNameString = nullptr;
        BOOL result = TRUE;
        IndexType indexType = GetIndexType(index, scriptContext, &indexVal, &propertyRecord, &propertyNameString, false, true);

        if (indexType == IndexType_Number)
        {
            result = JavascriptOperators::DeleteItem(object, indexVal, propertyOperationFlags);
        }
        else if (indexType == IndexType_JavascriptString)
        {
            result = JavascriptOperators::DeleteProperty(object, propertyNameString, propertyOperationFlags);
        }
        else
        {
            Assert(indexType == IndexType_PropertyId);

            if (propertyRecord == nullptr && !JavascriptOperators::CanShortcutOnUnknownPropertyName(object))
            {
                indexType = GetIndexTypeFromPrimitive(index, scriptContext, &indexVal, &propertyRecord, true);
                Assert(indexType == IndexType_PropertyId);
                Assert(propertyRecord != nullptr);
            }

            if (propertyRecord != nullptr)
            {
                result = JavascriptOperators::DeleteProperty(object, propertyRecord->GetPropertyId(), propertyOperationFlags);
            }
#if DBG
            else
            {
                JavascriptString* indexStr = JavascriptConversion::ToString(index, scriptContext);
                PropertyRecord const * debugPropertyRecord;
                scriptContext->GetOrAddPropertyRecord(indexStr, &debugPropertyRecord);
                AssertMsg(JavascriptOperators::DeleteProperty(object, debugPropertyRecord->GetPropertyId(), propertyOperationFlags), "delete should have been true. See OS Bug 2727708 if you see this come from the web");
            }
#endif
        }

        Assert(result || !(propertyOperationFlags & (PropertyOperation_StrictMode | PropertyOperation_ThrowOnDeleteIfNotConfig)));
        return scriptContext->GetLibrary()->CreateBoolean(result);
        JIT_HELPER_END(Op_DeleteElementI);
    }